

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementComponent,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcElement *this;
  
  this = (IfcElement *)operator_new(0x160);
  *(undefined ***)&this->field_0x148 = &PTR__Object_008a0070;
  *(undefined8 *)&this[1].super_IfcProduct.super_IfcObject = 0;
  *(char **)&this[1].super_IfcProduct.super_IfcObject.field_0x8 = "IfcElementComponent";
  Assimp::IFC::Schema_2x3::IfcElement::IfcElement(this,&PTR_construction_vtable_24__008e0f90);
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject = &PTR__IfcElementComponent_008e0e88;
  *(undefined ***)&this->field_0x148 = &PTR__IfcElementComponent_008e0f78;
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject.field_0x88 =
       &PTR__IfcElementComponent_008e0eb0;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcElementComponent_008e0ed8;
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject.field_0xd0 =
       &PTR__IfcElementComponent_008e0f00;
  *(undefined ***)&(this->super_IfcProduct).field_0x100 = &PTR__IfcElementComponent_008e0f28;
  *(undefined ***)&this->field_0x138 = &PTR__IfcElementComponent_008e0f50;
  GenericFill<Assimp::IFC::Schema_2x3::IfcElement>(db,params,this);
  return (Object *)
         (&(this->super_IfcProduct).super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcProduct).super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }